

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11FrameProcessor.cpp
# Opt level: O2

DUPL_RETURN __thiscall
SL::Screen_Capture::X11FrameProcessor::Init
          (X11FrameProcessor *this,shared_ptr<SL::Screen_Capture::Thread_Data> *data,
          Window *selectedwindow)

{
  long lVar1;
  XShmSegmentInfo *pXVar2;
  __uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> __p;
  int iVar3;
  Display *pDVar4;
  XImage *pXVar5;
  char *pcVar6;
  __uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> local_30;
  
  std::__shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2> *)this,
             &data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pDVar4 = (Display *)XOpenDisplay(0);
  this->SelectedDisplay = pDVar4;
  this->SelectedWindow = selectedwindow->Handle;
  if (pDVar4 != (Display *)0x0) {
    iVar3 = XDefaultScreen(pDVar4);
    std::make_unique<XShmSegmentInfo>();
    __p._M_t.super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
    super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl =
         local_30._M_t.
         super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
         super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl;
    local_30._M_t.super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
    super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl =
         (tuple<XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>)
         (_Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>)0x0;
    std::__uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::reset
              ((__uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
               &this->ShmInfo,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>
                        .super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl);
    std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::~unique_ptr
              ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)&local_30);
    lVar1 = *(long *)(this->SelectedDisplay + 0xe8);
    pXVar5 = (XImage *)
             XShmCreateImage(this->SelectedDisplay,
                             *(undefined8 *)(lVar1 + 0x40 + (long)iVar3 * 0x80),
                             *(undefined4 *)(lVar1 + 0x38 + (long)iVar3 * 0x80),2,0,
                             (this->ShmInfo)._M_t.
                             super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>
                             .super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl,
                             (selectedwindow->Size).x,(selectedwindow->Size).y);
    this->XImage_ = pXVar5;
    iVar3 = shmget(0,(long)pXVar5->height * (long)pXVar5->bytes_per_line,0x3ff);
    pXVar2 = (this->ShmInfo)._M_t.
             super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
             super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
             super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl;
    pXVar2->shmid = iVar3;
    pXVar2->readOnly = 0;
    pcVar6 = (char *)shmat(iVar3,(void *)0x0,0);
    this->XImage_->data = pcVar6;
    ((this->ShmInfo)._M_t.
     super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
     super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
     super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl)->shmaddr = pcVar6;
    XShmAttach(this->SelectedDisplay,
               (this->ShmInfo)._M_t.
               super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
               super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
               super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl);
  }
  return (uint)(pDVar4 == (Display *)0x0);
}

Assistant:

DUPL_RETURN X11FrameProcessor::Init(std::shared_ptr<Thread_Data> data, const Window& selectedwindow){
        
        auto ret = DUPL_RETURN::DUPL_RETURN_SUCCESS;
        Data = data; 
        SelectedDisplay = XOpenDisplay(NULL);
        SelectedWindow = selectedwindow.Handle;
        if(!SelectedDisplay) {
            return DUPL_RETURN::DUPL_RETURN_ERROR_EXPECTED;
        }
        int scr = XDefaultScreen(SelectedDisplay);

        ShmInfo = std::make_unique<XShmSegmentInfo>();

        XImage_ = XShmCreateImage(SelectedDisplay,
                                DefaultVisual(SelectedDisplay, scr),
                                DefaultDepth(SelectedDisplay, scr),
                                ZPixmap,
                                NULL,
                                ShmInfo.get(),
                                selectedwindow.Size.x,
                                selectedwindow.Size.y);
        ShmInfo->shmid = shmget(IPC_PRIVATE, XImage_->bytes_per_line * XImage_->height, IPC_CREAT | 0777);

        ShmInfo->readOnly = False;
        ShmInfo->shmaddr = XImage_->data = (char*)shmat(ShmInfo->shmid, 0, 0);

        XShmAttach(SelectedDisplay, ShmInfo.get());

        return ret;
    }